

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

int greatest_memory_printf_cb(void *t,void *udata)

{
  byte bVar1;
  FILE *__stream;
  int iVar2;
  ushort **ppuVar3;
  undefined8 uVar4;
  uint local_6c;
  int iStack_54;
  uchar c;
  int m;
  int len;
  size_t line_len;
  size_t line_i;
  size_t i;
  FILE *out;
  uchar diff_mark;
  uchar *buf;
  greatest_memory_cmp_env *env;
  void *udata_local;
  void *t_local;
  
  __stream = _stdout;
  iStack_54 = 0;
  for (line_i = 0; line_i < *(ulong *)((long)udata + 0x10); line_i = _m + line_i) {
    out._7_1_ = 0x20;
    _m = *(long *)((long)udata + 0x10) - line_i;
    if (0x10 < _m) {
      _m = 0x10;
    }
    for (line_len = line_i; line_len < line_i + _m; line_len = line_len + 1) {
      if (*(char *)(*udata + line_len) != *(char *)(*(long *)((long)udata + 8) + line_len)) {
        out._7_1_ = 0x58;
      }
    }
    iVar2 = fprintf(__stream,"\n%04x %c ",line_i & 0xffffffff,(ulong)out._7_1_);
    iStack_54 = iVar2 + iStack_54;
    for (line_len = line_i; line_len < line_i + _m; line_len = line_len + 1) {
      uVar4 = 0x3c;
      if (*(char *)(*udata + line_len) == *(char *)(*(long *)((long)udata + 8) + line_len)) {
        uVar4 = 0x20;
      }
      iVar2 = fprintf(__stream,"%02x%c",(ulong)*(byte *)((long)t + line_len),uVar4);
      iStack_54 = iVar2 + iStack_54;
    }
    for (line_len = 0; line_len < 0x10 - _m; line_len = line_len + 1) {
      iVar2 = fprintf(__stream,"   ");
      iStack_54 = iVar2 + iStack_54;
    }
    fprintf(__stream," ");
    for (line_len = line_i; line_len < line_i + _m; line_len = line_len + 1) {
      bVar1 = *(byte *)((long)t + line_len);
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)bVar1] & 0x4000) == 0) {
        local_6c = 0x2e;
      }
      else {
        local_6c = (uint)bVar1;
      }
      iVar2 = fprintf(__stream,"%c",(ulong)local_6c);
      iStack_54 = iVar2 + iStack_54;
    }
  }
  iVar2 = fprintf(__stream,"\n");
  return iVar2 + iStack_54;
}

Assistant:

int
main(int argc, char ** argv) {
    srandom(time(NULL));
    GREATEST_MAIN_BEGIN();
    RUN_SUITE(generic_pack_unpack_le);
    RUN_SUITE(generic_pack_unpack_be);
    RUN_SUITE(generic_mixed_endian);
    RUN_SUITE(plan);
    GREATEST_MAIN_END();
}